

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# client.cpp
# Opt level: O0

void __thiscall CClient::SwitchWindowScreen(CClient *this,int Index)

{
  uint uVar1;
  CConfig *pCVar2;
  IEngineGraphics *pIVar3;
  uint in_ESI;
  CClient *in_RDI;
  
  pCVar2 = Config(in_RDI);
  if (pCVar2->m_GfxFullscreen == 0) {
    pIVar3 = Graphics(in_RDI);
    uVar1 = (*(pIVar3->super_IGraphics).super_IInterface._vptr_IInterface[0x2f])
                      (pIVar3,(ulong)in_ESI);
    if ((uVar1 & 1) != 0) {
      pCVar2 = Config(in_RDI);
      pCVar2->m_GfxScreen = in_ESI;
    }
  }
  else {
    (*(in_RDI->super_IClient).super_IInterface._vptr_IInterface[0xe])();
    pIVar3 = Graphics(in_RDI);
    uVar1 = (*(pIVar3->super_IGraphics).super_IInterface._vptr_IInterface[0x2f])
                      (pIVar3,(ulong)in_ESI);
    if ((uVar1 & 1) != 0) {
      pCVar2 = Config(in_RDI);
      pCVar2->m_GfxScreen = in_ESI;
    }
    (*(in_RDI->super_IClient).super_IInterface._vptr_IInterface[0xe])();
  }
  return;
}

Assistant:

void CClient::SwitchWindowScreen(int Index)
{
	// Todo SDL: remove this when fixed (changing screen when in fullscreen is bugged)
	if(Config()->m_GfxFullscreen)
	{
		ToggleFullscreen();
		if(Graphics()->SetWindowScreen(Index))
			Config()->m_GfxScreen = Index;
		ToggleFullscreen();
	}
	else
	{
		if(Graphics()->SetWindowScreen(Index))
			Config()->m_GfxScreen = Index;
	}
}